

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall Application::updateOrder(Application *this,Order *order,char status)

{
  pointer pcVar1;
  Application *this_00;
  undefined1 local_5c8 [16];
  _Alloc_hider local_5b8;
  char local_5a8 [16];
  _Alloc_hider local_598;
  size_type local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  field_metrics local_578;
  string local_570;
  undefined1 local_550 [16];
  _Alloc_hider local_540;
  char local_530 [16];
  _Alloc_hider local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  field_metrics local_500;
  undefined1 local_4f8 [16];
  _Alloc_hider local_4e8;
  char local_4d8 [16];
  _Alloc_hider local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  field_metrics local_4a8;
  SenderCompID senderCompID;
  TargetCompID targetCompID;
  FieldBase local_3f0;
  FieldBase local_398;
  FieldBase local_340;
  FieldBase local_2e8;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  ExecutionReport fixOrder;
  
  targetCompID.super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0015b308;
  targetCompID.super_StringField.super_FieldBase.m_tag = 0x38;
  targetCompID.super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&targetCompID.super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (order->m_owner)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&targetCompID.super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + (order->m_owner)._M_string_length);
  targetCompID.super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&targetCompID.super_StringField.super_FieldBase.m_data.field_2;
  targetCompID.super_StringField.super_FieldBase.m_data._M_string_length = 0;
  targetCompID.super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  targetCompID.super_StringField.super_FieldBase.m_metrics.m_length = 0;
  targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
  targetCompID.super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0015b398;
  senderCompID.super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0015b308;
  senderCompID.super_StringField.super_FieldBase.m_tag = 0x31;
  senderCompID.super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&senderCompID.super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (order->m_target)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&senderCompID.super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + (order->m_target)._M_string_length);
  senderCompID.super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&senderCompID.super_StringField.super_FieldBase.m_data.field_2;
  senderCompID.super_StringField.super_FieldBase.m_data._M_string_length = 0;
  senderCompID.super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  senderCompID.super_StringField.super_FieldBase.m_metrics.m_length = 0;
  senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
  senderCompID.super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_0015b360;
  local_5c8._0_8_ = &PTR__FieldBase_0015b308;
  local_5c8._8_4_ = 0x25;
  local_5b8._M_p = local_5a8;
  pcVar1 = (order->m_clientId)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5b8,pcVar1,pcVar1 + (order->m_clientId)._M_string_length);
  local_598._M_p = (pointer)&local_588;
  local_590 = 0;
  local_588._M_local_buf[0] = '\0';
  local_578.m_length = 0;
  local_578.m_checksum = 0;
  local_5c8._0_8_ = &PTR__FieldBase_0015b830;
  IDGenerator::genExecutionID_abi_cxx11_(&local_570,&this->m_generator);
  local_4f8._0_8_ = &PTR__FieldBase_0015b308;
  local_4f8._8_4_ = 0x11;
  local_4e8._M_p = local_4d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,local_570._M_dataplus._M_p,
             local_570._M_dataplus._M_p + local_570._M_string_length);
  local_4c8._M_p = (pointer)&local_4b8;
  local_4c0 = 0;
  local_4b8._M_local_buf[0] = '\0';
  local_4a8.m_length = 0;
  local_4a8.m_checksum = 0;
  local_4f8._0_8_ = &PTR__FieldBase_0015b868;
  FIX::CharField::CharField((CharField *)&local_340,0x14,'0');
  local_340._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b8a0;
  FIX::CharField::CharField((CharField *)&local_398,0x96,status);
  local_398._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b8d8;
  FIX::CharField::CharField((CharField *)&local_3f0,0x27,status);
  local_3f0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b910;
  local_550._0_8_ = &PTR__FieldBase_0015b308;
  local_550._8_4_ = 0x37;
  local_540._M_p = local_530;
  this_00 = (Application *)(order->m_symbol)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_540,this_00,
             (pointer)((long)&(this_00->super_Application)._vptr_Application +
                      (order->m_symbol)._M_string_length));
  local_520._M_p = (pointer)&local_510;
  local_518 = 0;
  local_510._M_local_buf[0] = '\0';
  local_500.m_length = 0;
  local_500.m_checksum = 0;
  local_550._0_8_ = &PTR__FieldBase_0015b408;
  convert((Side *)&local_1e0,this_00,order->m_side);
  FIX::DoubleField::DoubleField((DoubleField *)&local_238,0x97,(double)order->m_openQuantity,0);
  local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b948;
  FIX::DoubleField::DoubleField((DoubleField *)&local_290,0xe,(double)order->m_executedQuantity,0);
  local_290._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b980;
  FIX::DoubleField::DoubleField((DoubleField *)&local_2e8,6,order->m_avgExecutedPrice,0);
  local_2e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b9b8;
  FIX42::ExecutionReport::ExecutionReport
            (&fixOrder,(OrderID *)local_5c8,(ExecID *)local_4f8,(ExecTransType *)&local_340,
             (ExecType *)&local_398,(OrdStatus *)&local_3f0,(Symbol *)local_550,(Side *)&local_1e0,
             (LeavesQty *)&local_238,(CumQty *)&local_290,(AvgPx *)&local_2e8);
  FIX::FieldBase::~FieldBase(&local_2e8);
  FIX::FieldBase::~FieldBase(&local_290);
  FIX::FieldBase::~FieldBase(&local_238);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_550);
  FIX::FieldBase::~FieldBase(&local_3f0);
  FIX::FieldBase::~FieldBase(&local_398);
  FIX::FieldBase::~FieldBase(&local_340);
  FIX::FieldBase::~FieldBase((FieldBase *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_5c8);
  local_5c8._0_8_ = &PTR__FieldBase_0015b308;
  local_5c8._8_4_ = 0xb;
  pcVar1 = (order->m_clientId)._M_dataplus._M_p;
  local_5b8._M_p = local_5a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5b8,pcVar1,pcVar1 + (order->m_clientId)._M_string_length);
  local_590 = 0;
  local_588._M_local_buf[0] = '\0';
  local_578.m_length = 0;
  local_578.m_checksum = 0;
  local_5c8._0_8_ = &PTR__FieldBase_0015b3d0;
  local_598._M_p = (pointer)&local_588;
  FIX::FieldMap::setField((FieldMap *)&fixOrder,(FieldBase *)local_5c8,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_5c8);
  FIX::DoubleField::DoubleField((DoubleField *)local_5c8,0x26,(double)order->m_quantity,0);
  local_5c8._0_8_ = &PTR__FieldBase_0015b558;
  FIX::FieldMap::setField((FieldMap *)&fixOrder,(FieldBase *)local_5c8,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_5c8);
  if ((byte)(status - 0x31U) < 2) {
    FIX::DoubleField::DoubleField
              ((DoubleField *)local_5c8,0x20,(double)order->m_lastExecutedQuantity,0);
    local_5c8._0_8_ = &PTR__FieldBase_0015ba98;
    FIX::FieldMap::setField((FieldMap *)&fixOrder,(FieldBase *)local_5c8,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_5c8);
    FIX::DoubleField::DoubleField((DoubleField *)local_5c8,0x1f,order->m_lastExecutedPrice,0);
    local_5c8._0_8_ = &PTR__FieldBase_0015bad0;
    FIX::FieldMap::setField((FieldMap *)&fixOrder,(FieldBase *)local_5c8,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_5c8);
  }
  local_5c8._0_8_ = (string *)&local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"");
  FIX::Session::sendToTarget((Message *)&fixOrder,&senderCompID,&targetCompID,(string *)local_5c8);
  if ((string *)local_5c8._0_8_ != (string *)&local_5b8) {
    operator_delete((void *)local_5c8._0_8_,(ulong)(local_5b8._M_p + 1));
  }
  FIX::Message::~Message((Message *)&fixOrder);
  FIX::FieldBase::~FieldBase((FieldBase *)&senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&targetCompID);
  return;
}

Assistant:

void Application::updateOrder(const Order &order, char status) {
  FIX::TargetCompID targetCompID(order.getOwner());
  FIX::SenderCompID senderCompID(order.getTarget());

  FIX42::ExecutionReport fixOrder(
      FIX::OrderID(order.getClientID()),
      FIX::ExecID(m_generator.genExecutionID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::ExecType(status),
      FIX::OrdStatus(status),
      FIX::Symbol(order.getSymbol()),
      FIX::Side(convert(order.getSide())),
      FIX::LeavesQty(order.getOpenQuantity()),
      FIX::CumQty(order.getExecutedQuantity()),
      FIX::AvgPx(order.getAvgExecutedPrice()));

  fixOrder.set(FIX::ClOrdID(order.getClientID()));
  fixOrder.set(FIX::OrderQty(order.getQuantity()));

  if (status == FIX::OrdStatus_FILLED || status == FIX::OrdStatus_PARTIALLY_FILLED) {
    fixOrder.set(FIX::LastShares(order.getLastExecutedQuantity()));
    fixOrder.set(FIX::LastPx(order.getLastExecutedPrice()));
  }

  try {
    FIX::Session::sendToTarget(fixOrder, senderCompID, targetCompID);
  } catch (FIX::SessionNotFound &) {}
}